

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O2

int fits_rcomp_byte(char *a,int nx,uchar *c,int clen,int nblock)

{
  char cVar1;
  int iVar2;
  void *__ptr;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  Buffer_t *pBVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  uint local_74;
  Buffer local_70;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  local_70.end = c + clen;
  local_70.start = c;
  local_70.current = c;
  __ptr = malloc((long)nblock * 4);
  iVar2 = -1;
  if (__ptr == (void *)0x0) {
    ffpmsg("fits_rcomp: insufficient memory");
  }
  else {
    local_70.bitbuffer = 0;
    local_70.bits_to_go = 8;
    output_nbits(&local_70,(int)*a,8);
    cVar7 = *a;
    local_48 = (long)nx;
    lVar11 = 0;
    local_74 = nblock;
    local_50 = (long)nblock;
    while (lVar3 = local_48 - lVar11, lVar3 != 0 && lVar11 <= local_48) {
      if (lVar3 < local_50) {
        local_74 = (uint)lVar3;
      }
      uVar15 = 0;
      if (0 < (int)local_74) {
        uVar15 = (ulong)local_74;
      }
      dVar16 = 0.0;
      for (uVar4 = 0; uVar15 != uVar4; uVar4 = uVar4 + 1) {
        cVar1 = a[uVar4];
        cVar7 = cVar1 - cVar7;
        uVar8 = (int)(cVar7 >> 7) ^ cVar7 * 2;
        *(uint *)((long)__ptr + uVar4 * 4) = uVar8;
        dVar16 = dVar16 + (double)(int)uVar8;
        cVar7 = cVar1;
      }
      dVar18 = ((dVar16 - (double)((int)local_74 / 2)) + -1.0) / (double)(int)local_74;
      dVar17 = 0.0;
      if (0.0 <= dVar18) {
        dVar17 = dVar18;
      }
      uVar10 = 0;
      for (uVar8 = (uint)dVar17; 1 < (byte)uVar8; uVar8 = (uint)(byte)((byte)uVar8 >> 1)) {
        uVar10 = uVar10 + 1;
      }
      local_40 = lVar11;
      if (uVar10 < 6) {
        if (((uVar10 != 0) || (dVar16 != 0.0)) || (NAN(dVar16))) {
          output_nbits(&local_70,uVar10 + 1,3);
          bVar5 = (byte)uVar10;
          uVar4 = local_70._0_8_ & 0xffffffff;
          local_38 = (ulong)-uVar10;
          iVar2 = local_70.bits_to_go;
          for (uVar12 = 0; iVar6 = (int)uVar4, uVar12 != uVar15; uVar12 = uVar12 + 1) {
            uVar8 = *(uint *)((long)__ptr + uVar12 * 4);
            iVar13 = (int)uVar8 >> (bVar5 & 0x1f);
            iVar9 = iVar13 - iVar2;
            if (iVar13 < iVar2) {
              uVar4 = (ulong)(iVar6 << ((byte)(iVar13 + 1) & 0x1f) | 1);
              iVar2 = iVar2 - (iVar13 + 1);
            }
            else {
              *local_70.current = (uchar)(iVar6 << ((byte)iVar2 & 0x1f));
              for (; local_70.current = local_70.current + 1, 7 < iVar9; iVar9 = iVar9 + -8) {
                *local_70.current = '\0';
              }
              iVar2 = 7 - iVar9;
              uVar4 = 1;
            }
            if (uVar10 != 0) {
              uVar8 = uVar8 & ~(-1 << (bVar5 & 0x1f)) | (int)uVar4 << (bVar5 & 0x1f);
              uVar4 = (ulong)uVar8;
              iVar6 = uVar10 - iVar2;
              for (iVar2 = iVar2 + -uVar10; iVar2 < 1; iVar2 = iVar2 + 8) {
                *local_70.current = (uchar)((int)uVar8 >> ((byte)iVar6 & 0x1f));
                local_70.current = local_70.current + 1;
                iVar6 = iVar6 + -8;
              }
            }
          }
          if (local_70.end < local_70.current) {
            ffpmsg("rice_encode: end of buffer");
            free(__ptr);
            return -1;
          }
          local_70.bits_to_go = iVar2;
          local_70.bitbuffer = iVar6;
        }
        else {
          output_nbits(&local_70,0,3);
        }
      }
      else {
        output_nbits(&local_70,7,3);
        for (uVar4 = 0; uVar15 != uVar4; uVar4 = uVar4 + 1) {
          output_nbits(&local_70,*(int *)((long)__ptr + uVar4 * 4),8);
        }
      }
      a = a + local_50;
      lVar11 = local_40 + local_50;
    }
    pBVar14 = local_70.current;
    if (local_70.bits_to_go < 8) {
      *local_70.current = (uchar)(local_70.bitbuffer << ((byte)local_70.bits_to_go & 0x1f));
      pBVar14 = local_70.current + 1;
    }
    free(__ptr);
    iVar2 = (int)pBVar14 - (int)local_70.start;
  }
  return iVar2;
}

Assistant:

int fits_rcomp_byte(
	  signed char a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize; */
int i, j, thisblock;

/* 
NOTE: in principle, the following 2 variable could be declared as 'short'
but in fact the code runs faster (on 32-bit Linux at least) as 'int'
*/
int lastpix, nextpix;
/* int pdiff; */
signed char pdiff; 
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
/* unsigned int psum; */
unsigned char psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 1;  */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move these out of switch block to further tweak performance */
    fsbits = 3;
    fsmax = 6;
    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first byte value to the first  byte of the buffer */
    if (output_nbits(buffer, a[0], 8) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}
	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
/*	psum = ((unsigned int) dpsum ) >> 1; */
	psum = ((unsigned char) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);
		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }
	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}